

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O2

int LinearSearch(int *a,int n,int x)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar1;
  }
  while( true ) {
    if (uVar2 == uVar1) {
      return -1;
    }
    if (a[uVar1] == x) break;
    uVar1 = uVar1 + 1;
  }
  return (int)uVar1;
}

Assistant:

int LinearSearch(int * a, int n, int x)
{
	int i = 0;
	while ( i < n && a[i] != x)
		i++;
	return (i < n) ? i : -1;
}